

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.h
# Opt level: O2

void __thiscall Application::Application(Application *this)

{
  allocator local_11;
  
  this->screenScale = 1.0;
  this->vsyncEnabled = true;
  this->_window = (GLFWwindow *)0x0;
  std::__cxx11::string::string((string *)&this->_windowName,"",&local_11);
  (this->_inputHandlers).
  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_inputHandlers).
  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_windowWidth = 0;
  this->_windowHeight = 0;
  (this->_inputHandlers).
  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

Application() {}